

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFUsedFont.cpp
# Opt level: O1

EStatusCode __thiscall
PDFUsedFont::WriteState(PDFUsedFont *this,ObjectsContext *inStateWriter,ObjectIDType inObjectID)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  IWrittenFont *pIVar2;
  EStatusCode EVar3;
  DictionaryContext *this_00;
  IndirectObjectsReferenceRegistry *this_01;
  ObjectIDType inObjectReference;
  string local_50;
  
  EVar3 = ObjectsContext::StartNewIndirectObject(inStateWriter,inObjectID);
  if (EVar3 == eSuccess) {
    this_00 = ObjectsContext::StartDictionary(inStateWriter);
    paVar1 = &local_50.field_2;
    local_50._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Type","");
    DictionaryContext::WriteKey(this_00,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar1) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    local_50._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"PDFUsedFont","");
    DictionaryContext::WriteNameValue(this_00,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar1) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if (this->mWrittenFont == (IWrittenFont *)0x0) {
      inObjectReference = 0;
    }
    else {
      this_01 = ObjectsContext::GetInDirectObjectsRegistry(inStateWriter);
      inObjectReference = IndirectObjectsReferenceRegistry::AllocateNewObjectID(this_01);
      local_50._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"mWrittenFont","");
      DictionaryContext::WriteKey(this_00,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != paVar1) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      DictionaryContext::WriteNewObjectReferenceValue(this_00,inObjectReference);
    }
    ObjectsContext::EndDictionary(inStateWriter,this_00);
    ObjectsContext::EndIndirectObject(inStateWriter);
    pIVar2 = this->mWrittenFont;
    if (pIVar2 != (IWrittenFont *)0x0) {
      (*pIVar2->_vptr_IWrittenFont[5])(pIVar2,inStateWriter,inObjectReference);
    }
  }
  return EVar3;
}

Assistant:

EStatusCode PDFUsedFont::WriteState(ObjectsContext* inStateWriter,ObjectIDType inObjectID)
{
	EStatusCode status = inStateWriter->StartNewIndirectObject(inObjectID);
	if(status != eSuccess)
		return status;
	DictionaryContext* pdfUsedFontObject = inStateWriter->StartDictionary();

	pdfUsedFontObject->WriteKey("Type");
	pdfUsedFontObject->WriteNameValue("PDFUsedFont");

	ObjectIDType writtenFontObject = 0;

	if(mWrittenFont)
	{
		writtenFontObject = inStateWriter->GetInDirectObjectsRegistry().AllocateNewObjectID();

		pdfUsedFontObject->WriteKey("mWrittenFont");
		pdfUsedFontObject->WriteNewObjectReferenceValue(writtenFontObject);
	}

	inStateWriter->EndDictionary(pdfUsedFontObject);
	inStateWriter->EndIndirectObject();

	if(mWrittenFont)
		mWrittenFont->WriteState(inStateWriter,writtenFontObject);

	return status;
}